

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,SortPartners_const&),SortPartners,SkipHistogram>
               (Master *master,Assigner *assigner,SortPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **reduce,SkipHistogram *skip)

{
  undefined4 uVar1;
  ReductionFunctor<void,_SortPartners> *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  element_type *peVar8;
  size_type sVar9;
  ReductionFunctor<void,_SortPartners> *in_RDX;
  Master *in_RDI;
  __node_base_ptr in_R8;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint i;
  int expected;
  uint round;
  int original_expected;
  shared_ptr<diy::spd::logger> log;
  undefined8 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  SkipInactiveOr<SortPartners,_SkipHistogram> *in_stack_fffffffffffffa08;
  SkipInactiveOr<SortPartners,_SkipHistogram> *__f;
  Master *in_stack_fffffffffffffa10;
  SortPartners *in_stack_fffffffffffffa18;
  Master *in_stack_fffffffffffffa20;
  Master *in_stack_fffffffffffffa28;
  ReductionFunctor<void,_SortPartners> *in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  Master *in_stack_fffffffffffffa40;
  SkipInactiveOr<SortPartners,_SkipHistogram> local_578 [2];
  SkipInactiveOr<SortPartners,_SkipHistogram> local_540 [4];
  MemoryManagement *in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb2f;
  Master *in_stack_fffffffffffffb30;
  Master *in_stack_fffffffffffffbf8;
  undefined1 local_328 [104];
  undefined4 local_2a8;
  undefined4 local_2a4;
  uint local_50;
  int local_3c;
  __node_base_ptr local_28;
  ReductionFunctor<void,_SortPartners> *local_18;
  Master *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  get_logger();
  local_3c = Master::expected(local_8);
  for (local_50 = 0; uVar6 = (ulong)local_50, sVar7 = SortPartners::rounds((SortPartners *)0x11a1f7)
      , uVar6 < sVar7; local_50 = local_50 + 1) {
    peVar8 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11a218);
    spd::logger::debug<unsigned_int>(peVar8,"Round {}",&stack0xffffffffffffffb0);
    std::function<void(void*,diy::ReduceProxy_const&,SortPartners_const&)>::
    function<void(*const&)(void*,diy::ReduceProxy_const&,SortPartners_const&),void>
              ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)> *)
               in_stack_fffffffffffffa10,
               (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **)in_stack_fffffffffffffa08);
    detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
              (in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
               (Callback *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
               (Assigner *)in_stack_fffffffffffffa10);
    detail::SkipInactiveOr<SortPartners,_SkipHistogram>::SkipInactiveOr
              ((SkipInactiveOr<SortPartners,_SkipHistogram> *)&stack0xfffffffffffffd60,local_50,
               (SortPartners *)local_18,(SkipHistogram *)local_28);
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<SortPartners,SkipHistogram>,void>
              ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffa10,
               in_stack_fffffffffffffa08);
    Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>
              (in_stack_fffffffffffffa40,
               (ReductionFunctor<void,_SortPartners> *)
               CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
               (Skip *)in_stack_fffffffffffffa30);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x11a2f1);
    detail::ReductionFunctor<void,_SortPartners>::~ReductionFunctor
              ((ReductionFunctor<void,_SortPartners> *)
               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    std::function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>::~function
              ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)> *)0x11a30b);
    Master::execute(in_stack_fffffffffffffbf8);
    local_2a4 = 0;
    for (local_2a8 = 0; uVar1 = local_2a8, uVar3 = Master::size((Master *)0x11a348), this = local_18
        , (uint)uVar1 < uVar3; local_2a8 = local_2a8 + 1) {
      iVar4 = local_50 + 1;
      iVar5 = Master::gid((Master *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      bVar2 = SortPartners::active((SortPartners *)this,iVar4,iVar5,local_8);
      if (bVar2) {
        in_stack_fffffffffffffa40 = (Master *)&stack0xfffffffffffffd40;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x11a3c9);
        in_stack_fffffffffffffa3c = local_50 + 1;
        in_stack_fffffffffffffa30 = local_18;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                    (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        SortPartners::incoming
                  ((SortPartners *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                   in_stack_fffffffffffffa38,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30,
                   in_stack_fffffffffffffa28);
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffd40);
        local_2a4 = local_2a4 + (int)sVar9;
        in_stack_fffffffffffffa20 = local_8;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                    (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        in_stack_fffffffffffffa28 =
             (Master *)
             Master::incoming((Master *)
                              CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                              (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear((concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 *)in_stack_fffffffffffffa10);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
      }
    }
    Master::set_expected(local_8,local_2a4);
    local_328._80_8_ = (pointer)0x0;
    local_328._88_8_ = (pointer)0x0;
    local_328._64_8_ = (pointer)0x0;
    local_328._72_8_ = 0;
    local_328._48_4_ = (type)0x0;
    local_328._52_4_ = (type)0x0;
    local_328._56_8_ = 0;
    local_328._32_8_ = 0;
    local_328._40_4_ = (type)0x0;
    local_328._44_4_ = (type)0x0;
    local_328._16_8_ = (pointer)0x0;
    local_328._24_8_ = (pointer)0x0;
    local_328._0_8_ = 0;
    local_328._8_8_ = 0;
    in_stack_fffffffffffffa18 = (SortPartners *)local_328;
    in_stack_fffffffffffffa10 = local_8;
    MemoryManagement::MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    Master::flush(in_stack_fffffffffffffb30,(bool)in_stack_fffffffffffffb2f,
                  in_stack_fffffffffffffb20);
    MemoryManagement::~MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  }
  peVar8 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11a613);
  iVar4 = (int)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  spd::logger::debug<unsigned_int>(peVar8,"Round {}",&stack0xffffffffffffffb0);
  __f = local_540;
  uVar3 = local_50;
  std::function<void(void*,diy::ReduceProxy_const&,SortPartners_const&)>::
  function<void(*const&)(void*,diy::ReduceProxy_const&,SortPartners_const&),void>
            ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)> *)
             in_stack_fffffffffffffa10,(_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **)__f)
  ;
  detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
            (in_stack_fffffffffffffa30,iVar4,(Callback *)in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa18,(Assigner *)in_stack_fffffffffffffa10);
  detail::SkipInactiveOr<SortPartners,_SkipHistogram>::SkipInactiveOr
            (local_578,local_50,(SortPartners *)local_18,(SkipHistogram *)local_28);
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<SortPartners,SkipHistogram>,void>
            ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffa10,__f);
  Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>
            (in_stack_fffffffffffffa40,
             (ReductionFunctor<void,_SortPartners> *)
             CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             (Skip *)in_stack_fffffffffffffa30);
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x11a6ea);
  detail::ReductionFunctor<void,_SortPartners>::~ReductionFunctor
            ((ReductionFunctor<void,_SortPartners> *)CONCAT44(uVar3,in_stack_fffffffffffffa00));
  std::function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>::~function
            ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)> *)0x11a704);
  Master::set_expected(local_8,local_3c);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x11a727);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}